

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *
math::wide_integer::operator/
          (uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>
           *__return_storage_ptr__,
          uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *u,
          uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *v)

{
  fixed_dynamic_array<unsigned_int,_512U,_std::allocator<unsigned_int>_> *other_array;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_30;
  
  detail::fixed_dynamic_array<unsigned_int,_64U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
            ((fixed_dynamic_array<unsigned_int,_64U,_std::allocator<unsigned_int>_> *)&local_30,
             &u->values);
  other_array = &uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>::operator/=
                           ((uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                            &local_30,v)->values;
  detail::fixed_dynamic_array<unsigned_int,_64U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
            ((fixed_dynamic_array<unsigned_int,_64U,_std::allocator<unsigned_int>_> *)
             __return_storage_ptr__,other_array);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            (&local_30);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto operator% (const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& u, const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& v) -> uintwide_t<Width2, LimbType, AllocatorType, IsSigned> { return uintwide_t<Width2, LimbType, AllocatorType, IsSigned>(u).operator%=(v); }